

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_new_points.cpp
# Opt level: O0

void initialize_interim_value_and_feedback(Am_Object *inter)

{
  bool bVar1;
  Am_Value_Type in_id;
  Am_ID_Tag AVar2;
  Am_Value *in_value;
  Am_Wrapper *pAVar3;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  byte local_41;
  bool feedback_is_window;
  Am_Object new_owner;
  Am_Object feedback;
  Am_Inter_Location local_18;
  Am_Inter_Location inter_data;
  Am_Object *inter_local;
  
  inter_data.data = (Am_Inter_Location_Data *)inter;
  Am_Inter_Location::Am_Inter_Location(&local_18);
  in_id = Am_Object::Get_Slot_Type(inter,0x16a,0);
  AVar2 = Am_Type_Class(in_id);
  if (AVar2 == 0x2000) {
    Am_Object::Make_Unique(inter,0x16a);
  }
  else {
    Am_Object::Am_Object(&feedback,&Am_No_Object);
    Am_Inter_Location::Set_Location(&local_18,false,&feedback,0,0,0,0,true);
    Am_Object::~Am_Object(&feedback);
    pAVar3 = Am_Inter_Location::operator_cast_to_Am_Wrapper_(&local_18);
    Am_Object::Set(inter,0x16a,pAVar3,0);
  }
  in_value = Am_Object::Get(inter,0xdc,0);
  Am_Object::Am_Object(&new_owner,in_value);
  Am_Object::Am_Object((Am_Object *)&stack0xffffffffffffffc0);
  bVar1 = Am_Object::Valid(&new_owner);
  if (bVar1) {
    Am_Object::Am_Object(&local_50,&Am_Window);
    bVar1 = Am_Object::Is_Instance_Of(&new_owner,&local_50);
    Am_Object::~Am_Object(&local_50);
    local_41 = bVar1;
    Am_Check_And_Fix_Feedback_Group(&local_58,&new_owner);
    Am_Object::operator=((Am_Object *)&stack0xffffffffffffffc0,&local_58);
    Am_Object::~Am_Object(&local_58);
    if ((local_41 & 1) != 0) {
      Am_Object::Am_Object(&local_60,inter);
      Am_Object::Am_Object(&local_68,&new_owner);
      Am_Add_Remove_Inter_To_Extra_Window(&local_60,&local_68,true,true);
      Am_Object::~Am_Object(&local_68);
      Am_Object::~Am_Object(&local_60);
    }
  }
  bVar1 = Am_Object::Valid((Am_Object *)&stack0xffffffffffffffc0);
  if (bVar1) {
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&stack0xffffffffffffffc0);
    Am_Object::Set(inter,0x170,pAVar3,1);
  }
  else {
    Am_Object::Get_Owner(&local_70,(Am_Slot_Flags)inter);
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_70);
    Am_Object::Set(inter,0x170,pAVar3,1);
    Am_Object::~Am_Object(&local_70);
  }
  Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffc0);
  Am_Object::~Am_Object(&new_owner);
  Am_Inter_Location::~Am_Inter_Location(&local_18);
  return;
}

Assistant:

void
initialize_interim_value_and_feedback(Am_Object inter)
{
  Am_Inter_Location inter_data;
  if (Am_Type_Class(inter.Get_Slot_Type(Am_INTERIM_VALUE)) == Am_WRAPPER) {
    inter.Make_Unique(Am_INTERIM_VALUE);
  } else {
    //set up with some temporary values
    inter_data.Set_Location(false, Am_No_Object, 0, 0, 0, 0);
    inter.Set(Am_INTERIM_VALUE, inter_data);
  }

  Am_Object feedback = inter.Get(Am_FEEDBACK_OBJECT);
  Am_Object new_owner;
  if (feedback.Valid()) {
#ifdef DEBUG
    //test for a frequent bug:
    if (!feedback.Get_Owner().Valid() || !feedback.Get(Am_WINDOW).Valid()) {
      std::cout << "** AMULET WARNING: feedback object " << feedback
                << " in interactor " << inter
                << " does not seem to be in a group or window,"
                << " so it won't be visible\n"
                << std::flush;
    }
#endif
    bool feedback_is_window = feedback.Is_Instance_Of(Am_Window);
    new_owner = Am_Check_And_Fix_Feedback_Group(feedback, inter);
    if (feedback_is_window)
      Am_Add_Remove_Inter_To_Extra_Window(inter, feedback, true, true);
  }
  if (new_owner.Valid())
    inter.Set(Am_SAVED_OLD_OWNER, new_owner, Am_OK_IF_NOT_THERE);
  else
    inter.Set(Am_SAVED_OLD_OWNER, inter.Get_Owner(), Am_OK_IF_NOT_THERE);
}